

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

void cnpy::npz_save<char>
               (string *zipname,string *fname,char *data,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *shape,string *mode)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  runtime_error *this;
  char *pcVar4;
  size_type sVar5;
  void *in_RDX;
  string *in_RSI;
  vector<char,_std::allocator<char>_> footer;
  vector<char,_std::allocator<char>_> local_header;
  uint32_t crc;
  size_t nbytes;
  size_t nels;
  vector<char,_std::allocator<char>_> npy_header;
  size_t res;
  size_t global_header_size;
  vector<char,_std::allocator<char>_> global_header;
  size_t global_header_offset;
  uint16_t nrecs;
  FILE *fp;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  vector<char,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *in_stack_fffffffffffffdb8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  vector<char,_std::allocator<char>_> *pvVar6;
  size_type in_stack_fffffffffffffdc8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffdf8;
  vector *pvVar7;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __first;
  const_iterator __position;
  vector<char,_std::allocator<char>_> local_168;
  string local_150 [32];
  char *local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed8;
  string local_f8 [32];
  vector<char,_std::allocator<char>_> local_d8;
  undefined4 local_bc;
  long local_b8;
  unsigned_long *local_a8;
  unsigned_long *local_a0;
  ulong local_98;
  vector<char,_std::allocator<char>_> local_90;
  size_t local_78;
  size_t local_70 [3];
  vector<char,_std::allocator<char>_> local_58;
  ulong local_40;
  ushort local_32;
  _IO_FILE *local_30;
  void *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::operator+=(in_RSI,".npy");
  local_30 = (_IO_FILE *)0x0;
  local_32 = 0;
  local_40 = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10e7c5);
  bVar1 = std::operator==(in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  if (bVar1) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_30 = fopen(pcVar4,"r+b");
  }
  if (local_30 == (_IO_FILE *)0x0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_30 = fopen(pcVar4,"wb");
  }
  else {
    cnpy::parse_zip_footer(local_30,&local_32,local_70,&local_40);
    fseek(local_30,local_40,0);
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_58,0);
    local_78 = fread(pvVar3,1,local_70[0],local_30);
    if (local_78 != local_70[0]) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"npz_save: header read error while adding to existing zip");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fseek(local_30,local_40,0);
  }
  create_npy_header<char>(in_stack_fffffffffffffed8);
  local_a0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffda8);
  local_a8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffda8);
  iVar2 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,int,std::multiplies<unsigned_long>>
                    (local_a0,local_a8,1);
  local_98 = (long)iVar2;
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_90);
  local_b8 = (long)iVar2 + sVar5;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_90,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_90);
  local_bc = crc32(0,pvVar3,sVar5 & 0xffffffff);
  local_bc = crc32(local_bc,local_18,local_98 & 0xffffffff);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10eafd);
  cnpy::operator+=((vector *)&local_d8,"PK");
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  std::__cxx11::string::size();
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  std::__cxx11::string::string(local_f8,in_RSI);
  cnpy::operator+=(&local_d8,local_f8);
  std::__cxx11::string::~string(local_f8);
  cnpy::operator+=((vector *)&local_58,"PK");
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  __position._M_current = (char *)&local_58;
  std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffda8);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffdb0,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffda8);
  __first._M_current = (char *)&local_d8;
  std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffda8);
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
            (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0);
  std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffda8);
  __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
            (in_stack_fffffffffffffdb8,(difference_type)in_stack_fffffffffffffdb0);
  local_130 = (char *)std::vector<char,std::allocator<char>>::
                      insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                                ((vector<char,_std::allocator<char>_> *)
                                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                                 __position,__first,in_stack_fffffffffffffdf8);
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  std::__cxx11::string::string(local_150,in_RSI);
  cnpy::operator+=(&local_58,local_150);
  std::__cxx11::string::~string(local_150);
  pvVar7 = (vector *)&local_168;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x10edd3);
  cnpy::operator+=(pvVar7,"PK");
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  std::vector<char,_std::allocator<char>_>::size(&local_58);
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  std::vector<char,_std::allocator<char>_>::size(&local_d8);
  operator+=(in_stack_fffffffffffffdc0,(uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  operator+=(in_stack_fffffffffffffdc0,(unsigned_short)((ulong)in_stack_fffffffffffffdb8 >> 0x30));
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_d8,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(&local_d8);
  fwrite(pvVar3,1,sVar5,local_30);
  pvVar6 = &local_90;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](pvVar6,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(pvVar6);
  fwrite(pvVar3,1,sVar5,local_30);
  fwrite(local_18,1,local_98,local_30);
  pvVar6 = &local_58;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](pvVar6,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(pvVar6);
  fwrite(pvVar3,1,sVar5,local_30);
  this_00 = &local_168;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](this_00,0);
  sVar5 = std::vector<char,_std::allocator<char>_>::size(this_00);
  fwrite(pvVar3,1,sVar5,local_30);
  fclose(local_30);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar6);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar6);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar6);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar6);
  return;
}

Assistant:

void npz_save(std::string zipname, std::string fname, const T* data, const std::vector<size_t>& shape, std::string mode = "w")
    {
        //first, append a .npy to the fname
        fname += ".npy";

        //now, on with the show
        FILE* fp = NULL;
        uint16_t nrecs = 0;
        size_t global_header_offset = 0;
        std::vector<char> global_header;

        if(mode == "a") fp = fopen(zipname.c_str(),"r+b");

        if(fp) {
            //zip file exists. we need to add a new npy file to it.
            //first read the footer. this gives us the offset and size of the global header
            //then read and store the global header.
            //below, we will write the the new data at the start of the global header then append the global header and footer below it
            size_t global_header_size;
            parse_zip_footer(fp,nrecs,global_header_size,global_header_offset);
            fseek(fp,global_header_offset,SEEK_SET);
            global_header.resize(global_header_size);
            size_t res = fread(&global_header[0],sizeof(char),global_header_size,fp);
            if(res != global_header_size){
                throw std::runtime_error("npz_save: header read error while adding to existing zip");
            }
            fseek(fp,global_header_offset,SEEK_SET);
        }
        else {
            fp = fopen(zipname.c_str(),"wb");
        }

        std::vector<char> npy_header = create_npy_header<T>(shape);

        size_t nels = std::accumulate(shape.begin(),shape.end(),1,std::multiplies<size_t>());
        size_t nbytes = nels*sizeof(T) + npy_header.size();

        //get the CRC of the data to be added
        uint32_t crc = crc32(0L,(uint8_t*)&npy_header[0],npy_header.size());
        crc = crc32(crc,(uint8_t*)data,nels*sizeof(T));

        //build the local header
        std::vector<char> local_header;
        local_header += "PK"; //first part of sig
        local_header += (uint16_t) 0x0403; //second part of sig
        local_header += (uint16_t) 20; //min version to extract
        local_header += (uint16_t) 0; //general purpose bit flag
        local_header += (uint16_t) 0; //compression method
        local_header += (uint16_t) 0; //file last mod time
        local_header += (uint16_t) 0;     //file last mod date
        local_header += (uint32_t) crc; //crc
        local_header += (uint32_t) nbytes; //compressed size
        local_header += (uint32_t) nbytes; //uncompressed size
        local_header += (uint16_t) fname.size(); //fname length
        local_header += (uint16_t) 0; //extra field length
        local_header += fname;

        //build global header
        global_header += "PK"; //first part of sig
        global_header += (uint16_t) 0x0201; //second part of sig
        global_header += (uint16_t) 20; //version made by
        global_header.insert(global_header.end(),local_header.begin()+4,local_header.begin()+30);
        global_header += (uint16_t) 0; //file comment length
        global_header += (uint16_t) 0; //disk number where file starts
        global_header += (uint16_t) 0; //internal file attributes
        global_header += (uint32_t) 0; //external file attributes
        global_header += (uint32_t) global_header_offset; //relative offset of local file header, since it begins where the global header used to begin
        global_header += fname;

        //build footer
        std::vector<char> footer;
        footer += "PK"; //first part of sig
        footer += (uint16_t) 0x0605; //second part of sig
        footer += (uint16_t) 0; //number of this disk
        footer += (uint16_t) 0; //disk where footer starts
        footer += (uint16_t) (nrecs+1); //number of records on this disk
        footer += (uint16_t) (nrecs+1); //total number of records
        footer += (uint32_t) global_header.size(); //nbytes of global headers
        footer += (uint32_t) (global_header_offset + nbytes + local_header.size()); //offset of start of global headers, since global header now starts after newly written array
        footer += (uint16_t) 0; //zip file comment length

        //write everything
        fwrite(&local_header[0],sizeof(char),local_header.size(),fp);
        fwrite(&npy_header[0],sizeof(char),npy_header.size(),fp);
        fwrite(data,sizeof(T),nels,fp);
        fwrite(&global_header[0],sizeof(char),global_header.size(),fp);
        fwrite(&footer[0],sizeof(char),footer.size(),fp);
        fclose(fp);
    }